

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  long lVar3;
  size_t data_size;
  
  lVar3 = (long)(this->IDStack).Size;
  if (0 < lVar3) {
    data_size = (long)str_end - (long)str;
    if (str_end == (char *)0x0) {
      data_size = 0;
    }
    IVar2 = ImHashStr(str,data_size,(this->IDStack).Data[lVar3 + -1]);
    pIVar1 = GImGui;
    if (GImGui->ActiveId == IVar2) {
      GImGui->ActiveIdIsAlive = IVar2;
    }
    if (pIVar1->ActiveIdPreviousFrame == IVar2) {
      pIVar1->ActiveIdPreviousFrameIsAlive = true;
    }
    return IVar2;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x538,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}